

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_3::SingularString::GenerateConstructorCode
          (SingularString *this,Printer *p)

{
  int iVar1;
  
  if ((this->super_FieldGeneratorBase).is_inlined_ == true) {
    if (*(long *)(*(long *)((this->super_FieldGeneratorBase).field_ + 0x50) + 8) == 0) {
      return;
    }
    if ((this->super_FieldGeneratorBase).is_oneof_ != false) {
      return;
    }
    (anonymous_namespace)::SingularString::GenerateConstructorCode();
  }
  if (((((this->super_FieldGeneratorBase).is_oneof_ == false) &&
       (google::protobuf::io::Printer::Emit(p,0,0,0x1f,"\n    $field_$.InitDefault();\n  "),
       *(int *)((long)&FieldDescriptor::kTypeToCppTypeMap +
               (ulong)(byte)(this->super_FieldGeneratorBase).field_[2] * 4) == 9)) &&
      (iVar1 = google::protobuf::FieldDescriptor::cpp_string_type(), iVar1 != 2)) &&
     (*(long *)(*(long *)((this->super_FieldGeneratorBase).field_ + 0x50) + 8) == 0)) {
    google::protobuf::io::Printer::Emit
              (p,0,0,0x6b,
               "\n      if ($pbi$::DebugHardenForceCopyDefaultString()) {\n        $field_$.Set(\"\", GetArena());\n      }\n    "
              );
    return;
  }
  return;
}

Assistant:

void SingularString::GenerateConstructorCode(io::Printer* p) const {
  if ((is_inlined() && EmptyDefault()) || is_oneof()) return;
  ABSL_DCHECK(!is_inlined());

  p->Emit(R"cc(
    $field_$.InitDefault();
  )cc");

  if (IsString(field_) && EmptyDefault()) {
    p->Emit(R"cc(
      if ($pbi$::DebugHardenForceCopyDefaultString()) {
        $field_$.Set("", GetArena());
      }
    )cc");
  }
}